

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

uint64_t Imf_3_2::anon_unknown_0::memstream_read
                   (exr_const_context_t f,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                   exr_stream_error_func_ptr_t errcb)

{
  ulong in_RCX;
  void *in_RDX;
  long *in_RSI;
  ulong in_R8;
  int64_t left;
  memdata *md;
  int64_t rdsz;
  size_t local_50;
  size_t local_48;
  uint64_t local_38;
  
  local_38 = 0;
  if (in_RSI != (long *)0x0) {
    if ((((ulong)in_RSI[1] < in_R8) || ((ulong)in_RSI[1] < in_RCX)) ||
       (local_48 = in_RCX, (ulong)in_RSI[1] < in_R8 + in_RCX)) {
      if (in_R8 < (ulong)in_RSI[1]) {
        local_50 = in_RSI[1] - in_R8;
      }
      else {
        local_50 = 0;
      }
      local_48 = local_50;
    }
    if (0 < (long)local_48) {
      memcpy(in_RDX,(void *)(*in_RSI + in_R8),local_48);
      local_38 = local_48;
    }
  }
  return local_38;
}

Assistant:

static uint64_t
memstream_read (
    exr_const_context_t         f,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t errcb)
{
    int64_t rdsz = 0;
    if (userdata)
    {
        memdata* md   = static_cast<memdata*> (userdata);
        int64_t left = sz;
        if (offset > md->bytes ||  sz > md->bytes || offset+sz > md->bytes)
            left = (offset < md->bytes) ? md->bytes - offset : 0;
        if (left > 0)
        {
            memcpy (buffer, md->data + offset, left);
            rdsz = left;
        }
    }

    return rdsz;
}